

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dataset.cpp
# Opt level: O0

void __thiscall DataSet::recursive_sort(DataSet *this,uint col,uint beg_row,uint end_row)

{
  uint end_row_00;
  bool bVar1;
  Shape SVar2;
  uint tmp_end_row;
  uint uStack_40;
  uint uStack_24;
  uint local_18;
  uint end_row_local;
  uint beg_row_local;
  uint col_local;
  DataSet *this_local;
  
  SVar2 = Matrix<double>::shape(&this->m_matrix);
  uStack_24 = SVar2.n_col;
  if (col < uStack_24 && beg_row < end_row) {
    sort_column(&this->m_matrix,col,beg_row,end_row);
    local_18 = beg_row;
    while( true ) {
      bVar1 = false;
      if (local_18 < end_row) {
        SVar2 = Matrix<double>::shape(&this->m_matrix);
        uStack_40 = SVar2.n_col;
        bVar1 = col < uStack_40 - 1;
      }
      if (!bVar1) break;
      end_row_00 = diff_index(&this->m_matrix,col,local_18,end_row);
      recursive_sort(this,col + 1,local_18,end_row_00);
      local_18 = end_row_00;
    }
  }
  return;
}

Assistant:

void DataSet::recursive_sort(unsigned col, unsigned beg_row, unsigned end_row){
    if(col>=m_matrix.shape().n_col || beg_row>=end_row) return ;

    sort_column(m_matrix, col, beg_row, end_row);
    for(;beg_row<end_row && col<m_matrix.shape().n_col-1;){
        unsigned tmp_end_row=diff_index(m_matrix, col, beg_row, end_row);
        recursive_sort(col+1, beg_row, tmp_end_row);
        beg_row=tmp_end_row;
    }
}